

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  SegmentReader *pSVar1;
  ExceptionGuard local_18;
  
  for (; start != end; start = start + 1) {
    pos->key = start->key;
    pSVar1 = (start->value).ptr;
    (pos->value).disposer = (start->value).disposer;
    (pos->value).ptr = pSVar1;
    (start->value).ptr = (SegmentReader *)0x0;
    pos = pos + 1;
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }